

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

int32_t ucnv_swapAliases_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                           UErrorCode *pErrorCode)

{
  void *pvVar1;
  long lVar2;
  void *__dest;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t uVar6;
  uint16_t uVar7;
  int32_t iVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  undefined1 *puVar11;
  long lVar12;
  void *pvVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  uint32_t offsets [10];
  uint32_t toc [10];
  uint16_t resort [500];
  TempRow rows [500];
  undefined8 in_stack_fffffffffffff318;
  undefined4 uVar24;
  size_t local_cb0;
  void *local_c78;
  undefined1 *local_c70;
  undefined1 *local_c68;
  code *local_c60;
  undefined8 local_c58;
  ulong uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  ulong local_c38;
  uint32_t local_c28 [3];
  uint uStack_c1c;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  long local_c00;
  undefined1 local_bf8 [1008];
  undefined1 local_808 [2008];
  
  uVar24 = (undefined4)((ulong)in_stack_fffffffffffff318 >> 0x20);
  iVar8 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  bVar20 = *(byte *)((long)inData + 0xd);
  if ((((bVar20 != 0x76 || *(byte *)((long)inData + 0xc) != 0x43) ||
       (bVar20 = 0x76, *(char *)((long)inData + 0xe) != 'A')) ||
      (*(char *)((long)inData + 0xf) != 'l')) || (*(char *)((long)inData + 0x10) != '\x03')) {
    udata_printError_63(ds,
                        "ucnv_swapAliases(): data format %02x.%02x.%02x.%02x (format version %02x) is not an alias table\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar20,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        CONCAT44(uVar24,(uint)*(byte *)((long)inData + 0x10)));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  if ((length < 0) || (uVar15 = length - iVar8, 0x23 < (int)uVar15)) {
    lVar22 = (long)iVar8;
    local_c18 = 0;
    uStack_c10 = 0;
    local_c28[0] = 0;
    local_c28[1] = 0;
    stack0xfffffffffffff3e0 = 0;
    local_c08 = 0;
    uVar9 = (*ds->readUInt32)(*(uint32_t *)((long)inData + lVar22));
    local_c28[0] = uVar9;
    if (uVar9 - 10 < 0xfffffffe) {
      udata_printError_63(ds,
                          "ucnv_swapAliases(): table of contents contains unsupported number of sections (%u sections)\n"
                         );
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      return 0;
    }
    pvVar1 = (void *)((long)inData + lVar22);
    uVar16 = uVar9 + 1;
    uVar23 = 1;
    do {
      uVar10 = (*ds->readUInt32)(*(uint32_t *)((long)pvVar1 + uVar23 * 4));
      local_c28[uVar23] = uVar10;
      uVar23 = uVar23 + 1;
    } while (uVar16 != uVar23);
    uStack_c50 = 0;
    local_c48 = 0;
    uStack_c40 = 0;
    local_c38 = 0;
    uVar15 = uVar16 * 2;
    local_c58 = (ulong)uVar15 << 0x20;
    lVar12 = 1;
    if (1 < uVar9) {
      do {
        uVar15 = uVar15 + local_c28[lVar12];
        *(uint *)((long)&local_c58 + lVar12 * 4 + 4) = uVar15;
        lVar2 = lVar12 - (ulong)uVar16;
        lVar12 = lVar12 + 1;
      } while (lVar2 != -2);
    }
    iVar21 = local_c28[lVar12] + *(int *)((long)&local_c58 + lVar12 * 4);
    if (-1 < length) {
      uVar15 = length - iVar8;
      if ((int)uVar15 < iVar21 * 2) goto LAB_0010ea87;
      pvVar17 = (void *)(lVar22 + (long)outData);
      (*ds->swapArray32)(ds,pvVar1,uVar16 * 4,pvVar17,pErrorCode);
      uVar23 = local_c38;
      pvVar13 = (void *)((local_c38 & 0xffffffff) * 2 + (long)pvVar17);
      (*ds->swapInvChars)(ds,(void *)((long)pvVar1 + (local_c38 & 0xffffffff) * 2),
                          (local_c08._4_4_ + (int)local_c08) * 2,pvVar13,pErrorCode);
      if (U_ZERO_ERROR < *pErrorCode) {
        udata_printError_63(ds,"ucnv_swapAliases().swapInvChars(charset names) failed\n");
        return 0;
      }
      uVar6 = ds->outCharset;
      if (ds->inCharset == uVar6) {
        uVar15 = local_c58._4_4_;
      }
      else {
        uVar15 = uStack_c1c;
        uVar19 = (ulong)uStack_c1c;
        puVar11 = local_808;
        local_c78 = pvVar13;
        if (uVar19 < 0x1f5) {
          local_c68 = local_bf8;
        }
        else {
          puVar11 = (undefined1 *)uprv_malloc_63((ulong)(uStack_c1c * 2) + uVar19 * 4);
          if (puVar11 == (undefined1 *)0x0) {
            local_c70 = puVar11;
            udata_printError_63(ds,
                                "ucnv_swapAliases(): unable to allocate memory for sorting tables (max length: %u)\n"
                                ,uVar19);
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            return 0;
          }
          local_c68 = puVar11 + uVar19 * 4;
          uVar6 = ds->outCharset;
        }
        uVar5 = uStack_c50;
        local_c60 = ucnv_io_stripEBCDICForCompare_63;
        if (uVar6 == '\0') {
          local_c60 = ucnv_io_stripASCIIForCompare_63;
        }
        uVar4 = uStack_c50 >> 0x20;
        uVar14 = local_c48 & 0xffffffff;
        local_c70 = puVar11;
        if (uVar19 != 0) {
          uVar18 = 0;
          do {
            uVar7 = (*ds->readUInt16)(*(uint16_t *)((long)pvVar1 + uVar18 * 2 + uVar4 * 2));
            *(uint16_t *)(puVar11 + uVar18 * 4) = uVar7;
            *(short *)(puVar11 + uVar18 * 4 + 2) = (short)uVar18;
            uVar18 = uVar18 + 1;
          } while (uVar19 != uVar18);
        }
        uprv_sortArray_63(puVar11,uVar15,4,io_compareRows,&local_c78,'\0',pErrorCode);
        puVar11 = local_c68;
        if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          pvVar13 = (void *)((long)pvVar17 + uVar4 * 2);
          __dest = (void *)((long)pvVar17 + uVar14 * 2);
          if (inData == outData) {
            if (uVar19 == 0) {
              local_cb0 = 0;
            }
            else {
              local_c00 = uVar19 * 2;
              lVar22 = 0;
              do {
                (*ds->swapArray16)(ds,(void *)((long)pvVar1 +
                                              (ulong)*(ushort *)(local_c70 + lVar22 * 2 + 2) * 2 +
                                              uVar4 * 2),2,puVar11 + lVar22,pErrorCode);
                lVar22 = lVar22 + 2;
              } while (local_c00 != lVar22);
              local_cb0 = uVar19 * 2;
              memcpy(pvVar13,puVar11,local_cb0);
              if (uVar19 != 0) {
                lVar22 = 0;
                do {
                  (*ds->swapArray16)(ds,(void *)((long)pvVar1 +
                                                (ulong)*(ushort *)(local_c70 + lVar22 * 2 + 2) * 2 +
                                                uVar14 * 2),2,puVar11 + lVar22,pErrorCode);
                  lVar22 = lVar22 + 2;
                } while (uVar19 * 2 != lVar22);
              }
            }
            memcpy(__dest,puVar11,local_cb0);
          }
          else if (uVar19 != 0) {
            lVar22 = 0;
            do {
              uVar3 = *(ushort *)(local_c70 + lVar22 * 2 + 2);
              (*ds->swapArray16)(ds,(void *)((long)pvVar1 + (ulong)((uint)uVar3 * 2) + uVar4 * 2),2,
                                 (void *)((long)pvVar13 + lVar22),pErrorCode);
              (*ds->swapArray16)(ds,(void *)((long)pvVar1 + (ulong)((uint)uVar3 * 2) + uVar14 * 2),2
                                 ,(void *)((long)__dest + lVar22),pErrorCode);
              lVar22 = lVar22 + 2;
            } while (uVar19 * 2 != lVar22);
          }
        }
        if (local_c70 != local_808) {
          uprv_free_63(local_c70);
        }
        if (U_ZERO_ERROR < *pErrorCode) {
          udata_printError_63(ds,"ucnv_swapAliases().uprv_sortArray(%u items) failed\n",uVar19);
          return 0;
        }
        (*ds->swapArray16)(ds,(void *)((ulong)local_c58._4_4_ * 2 + (long)pvVar1),
                           ((int)(uVar5 >> 0x20) - local_c58._4_4_) * 2,
                           (void *)((long)pvVar17 + (ulong)local_c58._4_4_ * 2),pErrorCode);
        uVar15 = local_c48._4_4_;
      }
      (*ds->swapArray16)(ds,(void *)((long)pvVar1 + (ulong)uVar15 * 2),((int)uVar23 - uVar15) * 2,
                         (void *)((long)pvVar17 + (ulong)uVar15 * 2),pErrorCode);
    }
    iVar8 = iVar21 * 2 + iVar8;
  }
  else {
LAB_0010ea87:
    iVar8 = 0;
    udata_printError_63(ds,
                        "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n",
                        (ulong)uVar15);
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return iVar8;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_swapAliases(const UDataSwapper *ds,
                 const void *inData, int32_t length, void *outData,
                 UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint16_t *inTable;
    const uint32_t *inSectionSizes;
    uint32_t toc[offsetsCount];
    uint32_t offsets[offsetsCount]; /* 16-bit-addressed offsets from inTable/outTable */
    uint32_t i, count, tocLength, topOffset;

    TempRow rows[STACK_ROW_CAPACITY];
    uint16_t resort[STACK_ROW_CAPACITY];
    TempAliasTable tempTable;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x43 &&   /* dataFormat="CvAl" */
        pInfo->dataFormat[1]==0x76 &&
        pInfo->dataFormat[2]==0x41 &&
        pInfo->dataFormat[3]==0x6c &&
        pInfo->formatVersion[0]==3
    )) {
        udata_printError(ds, "ucnv_swapAliases(): data format %02x.%02x.%02x.%02x (format version %02x) is not an alias table\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    /* an alias table must contain at least the table of contents array */
    if(length>=0 && (length-headerSize)<4*(1+minTocLength)) {
        udata_printError(ds, "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n",
                         length-headerSize);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    inSectionSizes=(const uint32_t *)((const char *)inData+headerSize);
    inTable=(const uint16_t *)inSectionSizes;
    uprv_memset(toc, 0, sizeof(toc));
    toc[tocLengthIndex]=tocLength=ds->readUInt32(inSectionSizes[tocLengthIndex]);
    if(tocLength<minTocLength || offsetsCount<=tocLength) {
        udata_printError(ds, "ucnv_swapAliases(): table of contents contains unsupported number of sections (%u sections)\n", tocLength);
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    /* read the known part of the table of contents */
    for(i=converterListIndex; i<=tocLength; ++i) {
        toc[i]=ds->readUInt32(inSectionSizes[i]);
    }

    /* compute offsets */
    uprv_memset(offsets, 0, sizeof(offsets));
    offsets[converterListIndex]=2*(1+tocLength); /* count two 16-bit units per toc entry */
    for(i=tagListIndex; i<=tocLength; ++i) {
        offsets[i]=offsets[i-1]+toc[i-1];
    }

    /* compute the overall size of the after-header data, in numbers of 16-bit units */
    topOffset=offsets[i-1]+toc[i-1];

    if(length>=0) {
        uint16_t *outTable;
        const uint16_t *p, *p2;
        uint16_t *q, *q2;
        uint16_t oldIndex;

        if((length-headerSize)<(2*(int32_t)topOffset)) {
            udata_printError(ds, "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n",
                             length-headerSize);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        outTable=(uint16_t *)((char *)outData+headerSize);

        /* swap the entire table of contents */
        ds->swapArray32(ds, inTable, 4*(1+tocLength), outTable, pErrorCode);

        /* swap unormalized strings & normalized strings */
        ds->swapInvChars(ds, inTable+offsets[stringTableIndex], 2*(int32_t)(toc[stringTableIndex]+toc[normalizedStringTableIndex]),
                             outTable+offsets[stringTableIndex], pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "ucnv_swapAliases().swapInvChars(charset names) failed\n");
            return 0;
        }

        if(ds->inCharset==ds->outCharset) {
            /* no need to sort, just swap all 16-bit values together */
            ds->swapArray16(ds,
                            inTable+offsets[converterListIndex],
                            2*(int32_t)(offsets[stringTableIndex]-offsets[converterListIndex]),
                            outTable+offsets[converterListIndex],
                            pErrorCode);
        } else {
            /* allocate the temporary table for sorting */
            count=toc[aliasListIndex];

            tempTable.chars=(const char *)(outTable+offsets[stringTableIndex]); /* sort by outCharset */

            if(count<=STACK_ROW_CAPACITY) {
                tempTable.rows=rows;
                tempTable.resort=resort;
            } else {
                tempTable.rows=(TempRow *)uprv_malloc(count*sizeof(TempRow)+count*2);
                if(tempTable.rows==NULL) {
                    udata_printError(ds, "ucnv_swapAliases(): unable to allocate memory for sorting tables (max length: %u)\n",
                                     count);
                    *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                    return 0;
                }
                tempTable.resort=(uint16_t *)(tempTable.rows+count);
            }

            if(ds->outCharset==U_ASCII_FAMILY) {
                tempTable.stripForCompare=ucnv_io_stripASCIIForCompare;
            } else /* U_EBCDIC_FAMILY */ {
                tempTable.stripForCompare=ucnv_io_stripEBCDICForCompare;
            }

            /*
             * Sort unique aliases+mapped names.
             *
             * We need to sort the list again by outCharset strings because they
             * sort differently for different charset families.
             * First we set up a temporary table with the string indexes and
             * sorting indexes and sort that.
             * Then we permutate and copy/swap the actual values.
             */
            p=inTable+offsets[aliasListIndex];
            q=outTable+offsets[aliasListIndex];

            p2=inTable+offsets[untaggedConvArrayIndex];
            q2=outTable+offsets[untaggedConvArrayIndex];

            for(i=0; i<count; ++i) {
                tempTable.rows[i].strIndex=ds->readUInt16(p[i]);
                tempTable.rows[i].sortIndex=(uint16_t)i;
            }

            uprv_sortArray(tempTable.rows, (int32_t)count, sizeof(TempRow),
                           io_compareRows, &tempTable,
                           FALSE, pErrorCode);

            if(U_SUCCESS(*pErrorCode)) {
                /* copy/swap/permutate items */
                if(p!=q) {
                    for(i=0; i<count; ++i) {
                        oldIndex=tempTable.rows[i].sortIndex;
                        ds->swapArray16(ds, p+oldIndex, 2, q+i, pErrorCode);
                        ds->swapArray16(ds, p2+oldIndex, 2, q2+i, pErrorCode);
                    }
                } else {
                    /*
                     * If we swap in-place, then the permutation must use another
                     * temporary array (tempTable.resort)
                     * before the results are copied to the outBundle.
                     */
                    uint16_t *r=tempTable.resort;

                    for(i=0; i<count; ++i) {
                        oldIndex=tempTable.rows[i].sortIndex;
                        ds->swapArray16(ds, p+oldIndex, 2, r+i, pErrorCode);
                    }
                    uprv_memcpy(q, r, 2*(size_t)count);

                    for(i=0; i<count; ++i) {
                        oldIndex=tempTable.rows[i].sortIndex;
                        ds->swapArray16(ds, p2+oldIndex, 2, r+i, pErrorCode);
                    }
                    uprv_memcpy(q2, r, 2*(size_t)count);
                }
            }

            if(tempTable.rows!=rows) {
                uprv_free(tempTable.rows);
            }

            if(U_FAILURE(*pErrorCode)) {
                udata_printError(ds, "ucnv_swapAliases().uprv_sortArray(%u items) failed\n",
                                 count);
                return 0;
            }

            /* swap remaining 16-bit values */
            ds->swapArray16(ds,
                            inTable+offsets[converterListIndex],
                            2*(int32_t)(offsets[aliasListIndex]-offsets[converterListIndex]),
                            outTable+offsets[converterListIndex],
                            pErrorCode);
            ds->swapArray16(ds,
                            inTable+offsets[taggedAliasArrayIndex],
                            2*(int32_t)(offsets[stringTableIndex]-offsets[taggedAliasArrayIndex]),
                            outTable+offsets[taggedAliasArrayIndex],
                            pErrorCode);
        }
    }

    return headerSize+2*(int32_t)topOffset;
}